

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall CTcSymEnumBase::~CTcSymEnumBase(CTcSymEnumBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CTcSymEnumBase(const char *str, size_t len, int copy, ulong id,
                   int is_token)
        : CTcSymbol(str, len, copy, TC_SYM_ENUM)
    {
        /* remember my ID */
        enum_id_ = id;

        /* remember if it's a 'token' enum */
        is_token_ = is_token;

        /* not yet referenced */
        ref_ = FALSE;
    }